

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void memory_unmap_sparc(uc_struct_conflict8 *uc,MemoryRegion *mr)

{
  uc_invalidate_tb_t_conflict8 p_Var1;
  uint64_t uVar2;
  undefined1 a [16];
  uint64_t uVar3;
  undefined8 in_stack_ffffffffffffffa8;
  uc_struct_conflict8 *puVar4;
  hwaddr local_20;
  hwaddr addr;
  MemoryRegion *mr_local;
  uc_struct_conflict8 *uc_local;
  
  if (uc->cpu != (CPUState *)0x0) {
    p_Var1 = uc->uc_invalidate_tb;
    uVar2 = mr->addr;
    a._8_8_ = uc;
    a._0_8_ = in_stack_ffffffffffffffa8;
    puVar4 = uc;
    uVar3 = int128_get64((Int128)a);
    (*p_Var1)(puVar4,uVar2,uVar3);
    for (local_20 = mr->addr; 0 < (long)(mr->end - local_20);
        local_20 = uc->target_page_size + local_20) {
      tlb_flush_page_sparc(uc->cpu,(target_ulong_conflict)local_20);
    }
  }
  memory_region_del_subregion_sparc(uc->system_memory,mr);
  memory_region_remove_mapped_block(uc,mr,true);
  return;
}

Assistant:

void memory_unmap(struct uc_struct *uc, MemoryRegion *mr)
{
    hwaddr addr;

    if (uc->cpu) {
        // We also need to remove all tb cache
        uc->uc_invalidate_tb(uc, mr->addr, int128_get64(mr->size));

        // Make sure all pages associated with the MemoryRegion are flushed
        // Only need to do this if we are in a running state
        for (addr = mr->addr; (int64_t)(mr->end - addr) > 0; addr += uc->target_page_size) {
           tlb_flush_page(uc->cpu, addr);
        }
    }
    memory_region_del_subregion(uc->system_memory, mr);
    memory_region_remove_mapped_block(uc, mr, true);
}